

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdNode ** Cudd_bddPickArbitraryMinterms(DdManager *dd,DdNode *f,DdNode **vars,int n,int k)

{
  size_t __size;
  int *piVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  DdNode **string;
  ulong uVar5;
  DdNode *pDVar6;
  ulong uVar7;
  DdNode **__ptr;
  DdNode **__ptr_00;
  char *__s2;
  ulong uVar8;
  long lVar9;
  DdNode *g;
  ulong uVar10;
  bool bVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  int local_4c;
  
  dVar14 = Cudd_CountMinterm(dd,f,n);
  if (dVar14 < (double)k) {
    return (DdNode **)0x0;
  }
  uVar2 = dd->size;
  string = (DdNode **)malloc((long)k << 3);
  if (string == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    return (DdNode **)0x0;
  }
  __size = (long)(int)uVar2 + 1;
  uVar10 = 0;
  uVar12 = 0;
  if (0 < (int)uVar2) {
    uVar12 = (ulong)uVar2;
  }
  uVar5 = 0;
  if (0 < k) {
    uVar5 = (ulong)(uint)k;
  }
  for (; uVar10 != uVar5; uVar10 = uVar10 + 1) {
    pDVar6 = (DdNode *)malloc(__size);
    string[uVar10] = pDVar6;
    if (pDVar6 == (DdNode *)0x0) {
      free(string);
      dd->errorCode = CUDD_MEMORY_OUT;
      return (DdNode **)0x0;
    }
    for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
      *(char *)((long)&string[uVar10]->index + uVar7) = '2';
    }
    *(char *)((long)&string[uVar10]->index + (long)(int)uVar2) = '\0';
  }
  __ptr = (DdNode **)malloc((long)n << 2);
  if (__ptr == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    for (uVar10 = 0; __ptr_00 = string, uVar5 != uVar10; uVar10 = uVar10 + 1) {
      if (string[uVar10] != (DdNode *)0x0) {
        free(string[uVar10]);
        string[uVar10] = (DdNode *)0x0;
      }
    }
  }
  else {
    uVar10 = 0;
    uVar12 = 0;
    if (0 < n) {
      uVar12 = (ulong)(uint)n;
    }
    for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
      *(DdHalfWord *)((long)__ptr + uVar10 * 4) = vars[uVar10]->index;
    }
    iVar4 = ddPickArbitraryMinterms(dd,f,n,k,(char **)string);
    if (iVar4 == 0) {
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        if (string[uVar10] != (DdNode *)0x0) {
          free(string[uVar10]);
          string[uVar10] = (DdNode *)0x0;
        }
      }
    }
    else {
      __ptr_00 = (DdNode **)malloc((long)k << 3);
      if (__ptr_00 != (DdNode **)0x0) {
        __s2 = (char *)malloc(__size);
        if (__s2 != (char *)0x0) {
          local_4c = -1;
          uVar10 = 0;
          lVar9 = 1;
          bVar3 = false;
LAB_00671c39:
          if (uVar10 == uVar5) {
            free(__s2);
            for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
              piVar1 = (int *)(((ulong)__ptr_00[uVar10] & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              if (string[uVar10] != (DdNode *)0x0) {
                free(string[uVar10]);
                string[uVar10] = (DdNode *)0x0;
              }
            }
            free(string);
            free(__ptr);
            return __ptr_00;
          }
          lVar13 = lVar9;
          if (bVar3) {
            pDVar6 = string[uVar10];
            iVar4 = strcmp((char *)pDVar6,__s2);
            if (iVar4 != 0) {
              do {
                if (k <= (int)lVar13) goto LAB_00671cc4;
                iVar4 = strcmp((char *)pDVar6,(char *)string[lVar13]);
                lVar13 = lVar13 + 1;
              } while (iVar4 != 0);
              goto LAB_00671ca7;
            }
            bVar11 = false;
            bVar3 = true;
          }
          else {
            do {
              if (k <= (int)lVar13) goto LAB_00671cc4;
              pDVar6 = string[uVar10];
              iVar4 = strcmp((char *)pDVar6,(char *)string[lVar13]);
              lVar13 = lVar13 + 1;
            } while (iVar4 != 0);
LAB_00671ca7:
            strcpy(__s2,(char *)pDVar6);
            bVar11 = true;
            bVar3 = true;
            local_4c = (int)uVar10;
          }
          goto LAB_00671cdb;
        }
        dd->errorCode = CUDD_MEMORY_OUT;
        for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
          if (string[uVar10] != (DdNode *)0x0) {
            free(string[uVar10]);
            string[uVar10] = (DdNode *)0x0;
          }
        }
        free(string);
        free(__ptr);
        goto LAB_00672039;
      }
      dd->errorCode = CUDD_MEMORY_OUT;
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        if (string[uVar10] != (DdNode *)0x0) {
          free(string[uVar10]);
          string[uVar10] = (DdNode *)0x0;
        }
      }
    }
    free(string);
    __ptr_00 = __ptr;
  }
  goto LAB_00672039;
LAB_00671cc4:
  bVar11 = true;
  bVar3 = false;
LAB_00671cdb:
  for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
    lVar13 = (long)*(int *)((long)__ptr + uVar7 * 4);
    if (*(char *)((long)&string[uVar10]->index + lVar13) == '2') {
      uVar8 = Cudd_Random();
      *(byte *)((long)&string[uVar10]->index + lVar13) = (uVar8 & 0x20) == 0 ^ 0x31;
    }
  }
LAB_00671d19:
  lVar13 = (long)local_4c;
  if (!bVar11) {
    do {
      bVar11 = (long)uVar10 <= lVar13;
      if ((long)uVar10 <= lVar13) goto LAB_00671d19;
      pDVar6 = string[uVar10];
      iVar4 = strcmp((char *)pDVar6,(char *)string[lVar13]);
      lVar13 = lVar13 + 1;
    } while (iVar4 != 0);
    strcpy((char *)pDVar6,__s2);
    for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
      lVar13 = (long)*(int *)((long)__ptr + uVar7 * 4);
      if (*(char *)((long)&string[uVar10]->index + lVar13) == '2') {
        uVar8 = Cudd_Random();
        *(byte *)((long)&string[uVar10]->index + lVar13) = (uVar8 & 0x20) == 0 ^ 0x31;
      }
    }
    goto LAB_00671d19;
  }
  pDVar6 = Cudd_ReadOne(dd);
  __ptr_00[uVar10] = pDVar6;
  piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
    g = vars[uVar7];
    if (*(char *)((long)&string[uVar10]->index + (long)*(int *)((long)__ptr + uVar7 * 4)) == '0') {
      g = (DdNode *)((ulong)g ^ 1);
    }
    pDVar6 = Cudd_bddAnd(dd,pDVar6,g);
    if (pDVar6 == (DdNode *)0x0) {
      free(__s2);
      for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
        if (string[uVar12] != (DdNode *)0x0) {
          free(string[uVar12]);
          string[uVar12] = (DdNode *)0x0;
        }
      }
      free(string);
      free(__ptr);
      for (uVar12 = 0xffffffffffffffff; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        Cudd_RecursiveDeref(dd,__ptr_00[uVar12 + 1]);
      }
      goto LAB_00672039;
    }
    piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,__ptr_00[uVar10]);
    __ptr_00[uVar10] = pDVar6;
  }
  iVar4 = Cudd_bddLeq(dd,pDVar6,f);
  if (iVar4 != 0) {
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 1;
    goto LAB_00671c39;
  }
  free(__s2);
  for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
    if (string[uVar12] != (DdNode *)0x0) {
      free(string[uVar12]);
      string[uVar12] = (DdNode *)0x0;
    }
  }
  free(string);
  free(__ptr);
  for (uVar12 = 0xffffffffffffffff; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    Cudd_RecursiveDeref(dd,__ptr_00[uVar12 + 1]);
  }
LAB_00672039:
  free(__ptr_00);
  return (DdNode **)0x0;
}

Assistant:

DdNode **
Cudd_bddPickArbitraryMinterms(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick k minterms */,
  DdNode ** vars /* array of variables */,
  int  n /* size of <code>vars</code> */,
  int  k /* number of minterms to find */)
{
    char **string;
    int i, j, l, size;
    int *indices;
    int result;
    DdNode **old, *neW;
    double minterms;
    char *saveString;
    int saveFlag, savePoint = -1, isSame;

    minterms = Cudd_CountMinterm(dd,f,n);
    if ((double)k > minterms) {
        return(NULL);
    }

    size = dd->size;
    string = ABC_ALLOC(char *, k);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < k; i++) {
        string[i] = ABC_ALLOC(char, size + 1);
        if (string[i] == NULL) {
            for (j = 0; j < i; j++)
                ABC_FREE(string[i]);
            ABC_FREE(string);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        for (j = 0; j < size; j++) string[i][j] = '2';
        string[i][size] = '\0';
    }
    indices = ABC_ALLOC(int,n);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        return(NULL);
    }

    for (i = 0; i < n; i++) {
        indices[i] = vars[i]->index;
    }

    result = ddPickArbitraryMinterms(dd,f,n,k,string);
    if (result == 0) {
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }

    old = ABC_ALLOC(DdNode *, k);
    if (old == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }
    saveString = ABC_ALLOC(char, size + 1);
    if (saveString == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        ABC_FREE(old);
        return(NULL);
    }
    saveFlag = 0;

    /* Build result BDD array. */
    for (i = 0; i < k; i++) {
        isSame = 0;
        if (!saveFlag) {
            for (j = i + 1; j < k; j++) {
                if (strcmp(string[i], string[j]) == 0) {
                    savePoint = i;
                    strcpy(saveString, string[i]);
                    saveFlag = 1;
                    break;
                }
            }
        } else {
            if (strcmp(string[i], saveString) == 0) {
                isSame = 1;
            } else {
                saveFlag = 0;
                for (j = i + 1; j < k; j++) {
                    if (strcmp(string[i], string[j]) == 0) {
                        savePoint = i;
                        strcpy(saveString, string[i]);
                        saveFlag = 1;
                        break;
                    }
                }
            }
        }
        /* Randomize choice for don't cares. */
        for (j = 0; j < n; j++) {
            if (string[i][indices[j]] == '2')
                string[i][indices[j]] =
                  (char) ((Cudd_Random() & 0x20) ? '1' : '0');
        }

        while (isSame) {
            isSame = 0;
            for (j = savePoint; j < i; j++) {
                if (strcmp(string[i], string[j]) == 0) {
                    isSame = 1;
                    break;
                }
            }
            if (isSame) {
                strcpy(string[i], saveString);
                /* Randomize choice for don't cares. */
                for (j = 0; j < n; j++) {
                    if (string[i][indices[j]] == '2')
                        string[i][indices[j]] =
                          (char) ((Cudd_Random() & 0x20) ? '1' : '0');
                }
            }
        }

        old[i] = Cudd_ReadOne(dd);
        cuddRef(old[i]);

        for (j = 0; j < n; j++) {
            if (string[i][indices[j]] == '0') {
                neW = Cudd_bddAnd(dd,old[i],Cudd_Not(vars[j]));
            } else {
                neW = Cudd_bddAnd(dd,old[i],vars[j]);
            }
            if (neW == NULL) {
                ABC_FREE(saveString);
                for (l = 0; l < k; l++)
                    ABC_FREE(string[l]);
                ABC_FREE(string);
                ABC_FREE(indices);
                for (l = 0; l <= i; l++)
                    Cudd_RecursiveDeref(dd,old[l]);
                ABC_FREE(old);
                return(NULL);
            }
            cuddRef(neW);
            Cudd_RecursiveDeref(dd,old[i]);
            old[i] = neW;
        }

        /* Test. */
        if (!Cudd_bddLeq(dd,old[i],f)) {
            ABC_FREE(saveString);
            for (l = 0; l < k; l++)
                ABC_FREE(string[l]);
            ABC_FREE(string);
            ABC_FREE(indices);
            for (l = 0; l <= i; l++)
                Cudd_RecursiveDeref(dd,old[l]);
            ABC_FREE(old);
            return(NULL);
        }
    }

    ABC_FREE(saveString);
    for (i = 0; i < k; i++) {
        cuddDeref(old[i]);
        ABC_FREE(string[i]);
    }
    ABC_FREE(string);
    ABC_FREE(indices);
    return(old);

}